

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int ssl_append_key_cert(mbedtls_ssl_key_cert **head,mbedtls_x509_crt *cert,mbedtls_pk_context *key)

{
  mbedtls_ssl_key_cert *pmVar1;
  mbedtls_ssl_key_cert *local_38;
  mbedtls_ssl_key_cert *cur;
  mbedtls_ssl_key_cert *new;
  mbedtls_pk_context *key_local;
  mbedtls_x509_crt *cert_local;
  mbedtls_ssl_key_cert **head_local;
  
  pmVar1 = (mbedtls_ssl_key_cert *)calloc(1,0x18);
  if (pmVar1 == (mbedtls_ssl_key_cert *)0x0) {
    head_local._4_4_ = -0x7f00;
  }
  else {
    pmVar1->cert = cert;
    pmVar1->key = key;
    pmVar1->next = (mbedtls_ssl_key_cert *)0x0;
    if (*head == (mbedtls_ssl_key_cert *)0x0) {
      *head = pmVar1;
    }
    else {
      for (local_38 = *head; local_38->next != (mbedtls_ssl_key_cert *)0x0;
          local_38 = local_38->next) {
      }
      local_38->next = pmVar1;
    }
    head_local._4_4_ = 0;
  }
  return head_local._4_4_;
}

Assistant:

static int ssl_append_key_cert( mbedtls_ssl_key_cert **head,
                                mbedtls_x509_crt *cert,
                                mbedtls_pk_context *key )
{
    mbedtls_ssl_key_cert *new;

    new = mbedtls_calloc( 1, sizeof( mbedtls_ssl_key_cert ) );
    if( new == NULL )
        return( MBEDTLS_ERR_SSL_ALLOC_FAILED );

    new->cert = cert;
    new->key  = key;
    new->next = NULL;

    /* Update head is the list was null, else add to the end */
    if( *head == NULL )
    {
        *head = new;
    }
    else
    {
        mbedtls_ssl_key_cert *cur = *head;
        while( cur->next != NULL )
            cur = cur->next;
        cur->next = new;
    }

    return( 0 );
}